

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkrequest.cpp
# Opt level: O1

QSslConfiguration __thiscall QNetworkRequest::sslConfiguration(QNetworkRequest *this)

{
  void *pvVar1;
  long *in_RSI;
  
  if (*(long *)(*in_RSI + 0x60) == 0) {
    pvVar1 = operator_new(8);
    QSslConfiguration::defaultConfiguration();
    *(void **)(*in_RSI + 0x60) = pvVar1;
  }
  QSslConfiguration::QSslConfiguration
            ((QSslConfiguration *)this,*(QSslConfiguration **)(*in_RSI + 0x60));
  return (QSharedDataPointer<QSslConfigurationPrivate>)
         (QSharedDataPointer<QSslConfigurationPrivate>)this;
}

Assistant:

QSslConfiguration QNetworkRequest::sslConfiguration() const
{
    if (!d->sslConfiguration)
        d->sslConfiguration = new QSslConfiguration(QSslConfiguration::defaultConfiguration());
    return *d->sslConfiguration;
}